

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_generated_dispatch.c
# Opt level: O0

PFNGLCLIENTACTIVETEXTUREARBPROC epoxy_glClientActiveTextureARB_resolver(void)

{
  PFNGLCLIENTACTIVETEXTUREARBPROC p_Var1;
  
  p_Var1 = (PFNGLCLIENTACTIVETEXTUREARBPROC)
           gl_provider_resolver
                     ("glClientActiveTextureARB",epoxy_glClientActiveTextureARB_resolver::providers,
                      epoxy_glClientActiveTextureARB_resolver::entrypoints);
  return p_Var1;
}

Assistant:

static PFNGLCLIENTACTIVETEXTUREARBPROC
epoxy_glClientActiveTextureARB_resolver(void)
{
    static const enum gl_provider providers[] = {
        GL_extension_GL_ARB_multitexture,
        Desktop_OpenGL_1_3,
        OpenGL_ES_1_0,
        gl_provider_terminator
    };
    static const uint32_t entrypoints[] = {
        4058 /* "glClientActiveTextureARB" */,
        4036 /* "glClientActiveTexture" */,
        4036 /* "glClientActiveTexture" */,
    };
    return gl_provider_resolver(entrypoint_strings + 4058 /* "glClientActiveTextureARB" */,
                                providers, entrypoints);
}